

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O1

uint RDL_addUEdge_g(RDL_graph *gra,uint from,uint to)

{
  RDL_edge **ppaRVar1;
  ulong uVar2;
  uint uVar3;
  uint *puVar4;
  uint **ppuVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = (ulong)from;
  if (from < gra->V && to < gra->V) {
    if (from != to) {
      if (gra->degree[uVar2] != 0) {
        lVar7 = 0;
        do {
          if (gra->adjList[uVar2][lVar7][0] == to) {
            puVar4 = &RDL_DUPLICATE_EDGE;
            goto LAB_0010790b;
          }
          lVar7 = lVar7 + 1;
        } while (gra->degree[uVar2] != (uint)lVar7);
      }
      RDL_addEdge(gra,from,to);
      RDL_addEdge(gra,to,from);
      uVar3 = gra->E - 1;
      gra->E = uVar3;
      if (uVar3 == gra->edgesAlloced) {
        uVar3 = gra->edgesAlloced * 2;
        gra->edgesAlloced = uVar3;
        ppuVar5 = (uint **)realloc(gra->edges,(ulong)uVar3 << 3);
        gra->edges = ppuVar5;
      }
      uVar3 = to;
      if (from < to) {
        uVar3 = from;
      }
      if (from <= to) {
        from = to;
      }
      puVar4 = (uint *)malloc(8);
      uVar6 = gra->E - 1;
      gra->edges[uVar6] = puVar4;
      ppuVar5 = gra->edges;
      *ppuVar5[uVar6] = uVar3;
      ppuVar5[gra->E - 1][1] = from;
      uVar3 = gra->E - 1;
      ppaRVar1 = gra->adjList;
      puVar4 = gra->degree;
      ppaRVar1[uVar2][puVar4[uVar2] - 1][1] = uVar3;
      ppaRVar1[to][puVar4[to] - 1][1] = uVar3;
      return uVar3;
    }
    (*RDL_outputFunc)(RDL_WARNING,"Adding a loop is not allowed, node %u\n",uVar2);
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"Tried to add an edge with atoms not in range.\n");
    (*RDL_outputFunc)(RDL_ERROR,"edge (%u,%u) can not be added to graph with %u atoms.\n",uVar2,
                      (ulong)to,(ulong)gra->V);
  }
  puVar4 = &RDL_INVALID_RESULT;
LAB_0010790b:
  return *puVar4;
}

Assistant:

unsigned RDL_addUEdge_g(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned edge_id, i;

  if(from >= gra->V || to >= gra->V) {
    RDL_outputFunc(RDL_ERROR, "Tried to add an edge with atoms not in range.\n");
    RDL_outputFunc(RDL_ERROR,  "edge (%u,%u) can not be added to graph with %u atoms.\n",
        from, to, gra->V);
    return RDL_INVALID_RESULT;
  }

  if (from == to) {
    RDL_outputFunc(RDL_WARNING, "Adding a loop is not allowed, node %u\n", from);
    return RDL_INVALID_RESULT;
  }

  for(i=0; i<gra->degree[from]; ++i) {
    if(gra->adjList[from][i][0] == to) {
      /*edge already exists*/
      return RDL_DUPLICATE_EDGE;
    }
  }
  RDL_addEdge(gra, from, to);
  RDL_addEdge(gra, to, from);
  --gra->E; /*was incremented twice*/

  edge_id = RDL_addToEdgeArray(gra, from, to);

  gra->adjList[from][gra->degree[from]-1][1] = edge_id;
  gra->adjList[to][gra->degree[to]-1][1] = edge_id;

  return edge_id;
}